

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilder.cc
# Opt level: O0

Value * __thiscall flow::IRBuilder::createBNot(IRBuilder *this,Value *rhs,string *name)

{
  bool bVar1;
  LiteralType LVar2;
  ConstantValue<bool,_(flow::LiteralType)1> *local_78;
  string local_50;
  ConstantValue<bool,_(flow::LiteralType)1> *local_30;
  ConstantBoolean *a;
  string *name_local;
  Value *rhs_local;
  IRBuilder *this_local;
  
  a = (ConstantBoolean *)name;
  name_local = (string *)rhs;
  rhs_local = (Value *)this;
  LVar2 = Value::type(rhs);
  if (LVar2 == Boolean) {
    if (name_local == (string *)0x0) {
      local_78 = (ConstantValue<bool,_(flow::LiteralType)1> *)0x0;
    }
    else {
      local_78 = (ConstantValue<bool,_(flow::LiteralType)1> *)
                 __dynamic_cast(name_local,&Value::typeinfo,
                                &ConstantValue<bool,(flow::LiteralType)1>::typeinfo,0);
    }
    local_30 = local_78;
    if (local_78 == (ConstantValue<bool,_(flow::LiteralType)1> *)0x0) {
      makeName(&local_50,this,(string *)a);
      this_local = (IRBuilder *)
                   insert<flow::UnaryInstr<(flow::UnaryOperator)2,(flow::LiteralType)1>,flow::Value*&,std::__cxx11::string>
                             (this,(Value **)&name_local,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
    }
    else {
      bVar1 = ConstantValue<bool,_(flow::LiteralType)1>::get(local_78);
      this_local = (IRBuilder *)getBoolean(this,(bool)((bVar1 ^ 0xffU) & 1));
    }
    return (Value *)this_local;
  }
  __assert_fail("rhs->type() == LiteralType::Boolean",
                "/workspace/llm4binary/github/license_all_cmakelists_25/christianparpart[P]flow/src/flow/ir/IRBuilder.cc"
                ,0x8b,"Value *flow::IRBuilder::createBNot(Value *, const std::string &)");
}

Assistant:

Value* IRBuilder::createBNot(Value* rhs, const std::string& name) {
  assert(rhs->type() == LiteralType::Boolean);

  if (auto a = dynamic_cast<ConstantBoolean*>(rhs))
    return getBoolean(!a->get());

  return insert<BNotInstr>(rhs, makeName(name));
}